

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O3

void __thiscall
btGeneric6DofConstraint::calculateTransforms
          (btGeneric6DofConstraint *this,btTransform *transA,btTransform *transB)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  fVar22 = (transA->m_basis).m_el[0].m_floats[0];
  fVar1 = (transA->m_basis).m_el[0].m_floats[1];
  fVar2 = (transA->m_basis).m_el[0].m_floats[2];
  fVar3 = (this->m_frameInA).m_basis.m_el[0].m_floats[2];
  fVar4 = (this->m_frameInA).m_basis.m_el[1].m_floats[2];
  fVar5 = (this->m_frameInA).m_basis.m_el[2].m_floats[2];
  fVar6 = (transA->m_basis).m_el[1].m_floats[0];
  fVar7 = (transA->m_basis).m_el[1].m_floats[1];
  fVar8 = (transA->m_basis).m_el[1].m_floats[2];
  fVar9 = (transA->m_basis).m_el[2].m_floats[0];
  fVar10 = (transA->m_basis).m_el[2].m_floats[1];
  fVar11 = (transA->m_basis).m_el[2].m_floats[2];
  fVar12 = (this->m_frameInA).m_origin.m_floats[0];
  fVar13 = (this->m_frameInA).m_origin.m_floats[1];
  fVar14 = (this->m_frameInA).m_origin.m_floats[2];
  uVar16 = *(undefined8 *)(transA->m_origin).m_floats;
  fVar15 = (transA->m_origin).m_floats[2];
  uVar17 = *(undefined8 *)(this->m_frameInA).m_basis.m_el[0].m_floats;
  uVar18 = *(undefined8 *)(this->m_frameInA).m_basis.m_el[1].m_floats;
  fVar27 = (float)uVar18;
  fVar28 = (float)((ulong)uVar18 >> 0x20);
  fVar25 = (float)uVar17;
  fVar26 = (float)((ulong)uVar17 >> 0x20);
  uVar17 = *(undefined8 *)(this->m_frameInA).m_basis.m_el[2].m_floats;
  fVar23 = (float)uVar17;
  fVar24 = (float)((ulong)uVar17 >> 0x20);
  *(ulong *)(this->m_calculatedTransformA).m_basis.m_el[0].m_floats =
       CONCAT44(fVar2 * fVar24 + fVar22 * fVar26 + fVar1 * fVar28,
                fVar2 * fVar23 + fVar22 * fVar25 + fVar1 * fVar27);
  (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[2] =
       fVar5 * fVar2 + fVar3 * fVar22 + fVar1 * fVar4;
  (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[3] = 0.0;
  *(ulong *)(this->m_calculatedTransformA).m_basis.m_el[1].m_floats =
       CONCAT44(fVar8 * fVar24 + fVar6 * fVar26 + fVar7 * fVar28,
                fVar8 * fVar23 + fVar6 * fVar25 + fVar7 * fVar27);
  (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[2] =
       fVar5 * fVar8 + fVar3 * fVar6 + fVar4 * fVar7;
  (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[3] = 0.0;
  *(ulong *)(this->m_calculatedTransformA).m_basis.m_el[2].m_floats =
       CONCAT44(fVar11 * fVar24 + fVar9 * fVar26 + fVar10 * fVar28,
                fVar11 * fVar23 + fVar9 * fVar25 + fVar10 * fVar27);
  (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[2] =
       fVar5 * fVar11 + fVar3 * fVar9 + fVar4 * fVar10;
  (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[3] = 0.0;
  auVar19._4_4_ = (float)((ulong)uVar16 >> 0x20) + fVar8 * fVar14 + fVar6 * fVar12 + fVar13 * fVar7;
  auVar19._0_4_ = (float)uVar16 + fVar2 * fVar14 + fVar22 * fVar12 + fVar13 * fVar1;
  auVar19._8_4_ = fVar14 * fVar11 + fVar12 * fVar9 + fVar10 * fVar13 + fVar15;
  auVar19._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_calculatedTransformA).m_origin.m_floats = auVar19;
  fVar22 = (transB->m_basis).m_el[0].m_floats[0];
  fVar1 = (transB->m_basis).m_el[0].m_floats[1];
  fVar2 = (transB->m_basis).m_el[0].m_floats[2];
  fVar3 = (this->m_frameInB).m_basis.m_el[0].m_floats[2];
  fVar4 = (this->m_frameInB).m_basis.m_el[1].m_floats[2];
  fVar5 = (this->m_frameInB).m_basis.m_el[2].m_floats[2];
  fVar6 = (transB->m_basis).m_el[1].m_floats[0];
  fVar7 = (transB->m_basis).m_el[1].m_floats[1];
  fVar8 = (transB->m_basis).m_el[1].m_floats[2];
  fVar9 = (transB->m_basis).m_el[2].m_floats[0];
  fVar10 = (transB->m_basis).m_el[2].m_floats[1];
  fVar11 = (transB->m_basis).m_el[2].m_floats[2];
  fVar12 = (this->m_frameInB).m_origin.m_floats[0];
  fVar13 = (this->m_frameInB).m_origin.m_floats[1];
  fVar14 = (this->m_frameInB).m_origin.m_floats[2];
  uVar16 = *(undefined8 *)(transB->m_origin).m_floats;
  fVar15 = (transB->m_origin).m_floats[2];
  uVar17 = *(undefined8 *)(this->m_frameInB).m_basis.m_el[0].m_floats;
  uVar18 = *(undefined8 *)(this->m_frameInB).m_basis.m_el[1].m_floats;
  fVar27 = (float)uVar18;
  fVar28 = (float)((ulong)uVar18 >> 0x20);
  fVar25 = (float)uVar17;
  fVar26 = (float)((ulong)uVar17 >> 0x20);
  uVar17 = *(undefined8 *)(this->m_frameInB).m_basis.m_el[2].m_floats;
  fVar23 = (float)uVar17;
  fVar24 = (float)((ulong)uVar17 >> 0x20);
  *(ulong *)(this->m_calculatedTransformB).m_basis.m_el[0].m_floats =
       CONCAT44(fVar2 * fVar24 + fVar22 * fVar26 + fVar1 * fVar28,
                fVar2 * fVar23 + fVar22 * fVar25 + fVar1 * fVar27);
  (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[2] =
       fVar5 * fVar2 + fVar3 * fVar22 + fVar1 * fVar4;
  (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[3] = 0.0;
  *(ulong *)(this->m_calculatedTransformB).m_basis.m_el[1].m_floats =
       CONCAT44(fVar8 * fVar24 + fVar6 * fVar26 + fVar7 * fVar28,
                fVar8 * fVar23 + fVar6 * fVar25 + fVar7 * fVar27);
  (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[2] =
       fVar5 * fVar8 + fVar3 * fVar6 + fVar4 * fVar7;
  (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[3] = 0.0;
  *(ulong *)(this->m_calculatedTransformB).m_basis.m_el[2].m_floats =
       CONCAT44(fVar11 * fVar24 + fVar9 * fVar26 + fVar10 * fVar28,
                fVar11 * fVar23 + fVar9 * fVar25 + fVar10 * fVar27);
  (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[2] =
       fVar5 * fVar11 + fVar3 * fVar9 + fVar4 * fVar10;
  (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[3] = 0.0;
  auVar20._4_4_ = (float)((ulong)uVar16 >> 0x20) + fVar8 * fVar14 + fVar6 * fVar12 + fVar13 * fVar7;
  auVar20._0_4_ = (float)uVar16 + fVar2 * fVar14 + fVar22 * fVar12 + fVar13 * fVar1;
  auVar20._8_4_ = fVar14 * fVar11 + fVar12 * fVar9 + fVar10 * fVar13 + fVar15;
  auVar20._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_calculatedTransformB).m_origin.m_floats = auVar20;
  calculateLinearInfo(this);
  calculateAngleInfo(this);
  if (this->m_useOffsetForConstraintFrame == true) {
    fVar22 = ((this->super_btTypedConstraint).m_rbA)->m_inverseMass;
    fVar1 = ((this->super_btTypedConstraint).m_rbB)->m_inverseMass;
    this->m_hasStaticBody = (bool)((-(fVar22 < 1.1920929e-07) | -(fVar1 < 1.1920929e-07)) & 1);
    fVar22 = fVar22 + fVar1;
    uVar21 = -(uint)(0.0 < fVar22);
    fVar22 = (float)(~uVar21 & 0x3f000000 | (uint)(fVar1 / fVar22) & uVar21);
    this->m_factA = fVar22;
    this->m_factB = 1.0 - fVar22;
  }
  return;
}

Assistant:

void btGeneric6DofConstraint::calculateTransforms(const btTransform& transA,const btTransform& transB)
{
	m_calculatedTransformA = transA * m_frameInA;
	m_calculatedTransformB = transB * m_frameInB;
	calculateLinearInfo();
	calculateAngleInfo();
	if(m_useOffsetForConstraintFrame)
	{	//  get weight factors depending on masses
		btScalar miA = getRigidBodyA().getInvMass();
		btScalar miB = getRigidBodyB().getInvMass();
		m_hasStaticBody = (miA < SIMD_EPSILON) || (miB < SIMD_EPSILON);
		btScalar miS = miA + miB;
		if(miS > btScalar(0.f))
		{
			m_factA = miB / miS;
		}
		else 
		{
			m_factA = btScalar(0.5f);
		}
		m_factB = btScalar(1.0f) - m_factA;
	}
}